

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

size_t flatbuffers::InlineAlignment(Type *type)

{
  bool bVar1;
  Type *local_40;
  Type local_38;
  Type *local_18;
  Type *type_local;
  
  local_18 = type;
  bVar1 = IsStruct(type);
  if (bVar1) {
    type_local = (Type *)local_18->struct_def->minalign;
  }
  else {
    bVar1 = IsArray(local_18);
    if (bVar1) {
      Type::VectorType(&local_38,local_18);
      bVar1 = IsStruct(&local_38);
      if (bVar1) {
        local_40 = (Type *)local_18->struct_def->minalign;
      }
      else {
        local_40 = (Type *)SizeOf(local_18->element);
      }
      type_local = local_40;
    }
    else {
      type_local = (Type *)SizeOf(local_18->base_type);
    }
  }
  return (size_t)type_local;
}

Assistant:

inline size_t InlineAlignment(const Type &type) {
  if (IsStruct(type)) {
    return type.struct_def->minalign;
  } else if (IsArray(type)) {
    return IsStruct(type.VectorType()) ? type.struct_def->minalign
                                       : SizeOf(type.element);
  } else {
    return SizeOf(type.base_type);
  }
}